

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  PointerType pSVar8;
  PointerType pcVar9;
  size_t sVar10;
  char *__s;
  PointerType pBVar11;
  uint uVar12;
  PositionType *this_00;
  string __str;
  utsname uts_name;
  string local_1f8;
  long *local_1d8;
  uint local_1d0;
  long local_1c8 [2];
  allocator<char> local_1b1;
  undefined1 local_1b0 [392];
  
  pcVar1 = local_1b0 + 0x10;
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"UNIX","");
  paVar2 = &local_1f8.field_2;
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"1","");
  this_00 = &this->Position;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,(string *)local_1b0,local_1f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  local_1b0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"CMAKE_HOST_UNIX","");
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"1","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,(string *)local_1b0,local_1f8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_1b0._0_8_ != pcVar1) {
    operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
  }
  iVar6 = uname((utsname *)local_1b0);
  if (-1 < iVar6) {
    local_1f8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f8,"CMAKE_HOST_SYSTEM_NAME","");
    local_1d8 = local_1c8;
    sVar10 = strlen(local_1b0);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1d8,local_1b0,local_1b0 + sVar10);
    pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
    cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_MAJOR_VERSION","");
  uVar7 = cmVersion::GetMajorVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_002616c6;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_002616c6;
      }
      if (uVar12 < 10000) goto LAB_002616c6;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_002616c6:
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,local_1d0,uVar7);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_MINOR_VERSION","");
  uVar7 = cmVersion::GetMinorVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_002617ac;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_002617ac;
      }
      if (uVar12 < 10000) goto LAB_002617ac;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_002617ac:
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,local_1d0,uVar7);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_PATCH_VERSION","");
  uVar7 = cmVersion::GetPatchVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026188c;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026188c;
      }
      if (uVar12 < 10000) goto LAB_0026188c;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026188c:
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,local_1d0,uVar7);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_TWEAK_VERSION","");
  uVar7 = cmVersion::GetTweakVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026196c;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026196c;
      }
      if (uVar12 < 10000) goto LAB_0026196c;
      bVar3 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026196c:
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,local_1d0,uVar7);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_VERSION","");
  __s = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,__s,&local_1b1);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"CMAKE_FILES_DIRECTORY","");
  local_1d8 = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/CMakeFiles","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_1f8,(char *)local_1d8);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      (&pSVar8->BuildSystemDirectory);
  local_1f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"INCLUDE_REGULAR_EXPRESSION","");
  cmPropertyMap::SetProperty(&pBVar11->Properties,&local_1f8,"^.*$");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
/* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
  With CMake must separate between target and host platform. In most cases
  the tests for WIN32, UNIX and APPLE will be for the target system, so an
  additional set of variables for the host system is required ->
  CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
  WIN32, UNIX and APPLE are now set in the platform files in
  Modules/Platforms/.
  To keep cmake scripts (-P) and custom language and compiler modules
  working, these variables are still also set here in this place, but they
  will be reset in CMakeSystemSpecificInformation.cmake before the platform
  files are executed. */
#if defined(_WIN32)
  this->SetDefinition("WIN32", "1");
  this->SetDefinition("CMAKE_HOST_WIN32", "1");
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", "Windows");
#else
  this->SetDefinition("UNIX", "1");
  this->SetDefinition("CMAKE_HOST_UNIX", "1");

  struct utsname uts_name;
  if (uname(&uts_name) >= 0) {
    this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", uts_name.sysname);
  }
#endif
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmSystemTools::IsOn(legacy.c_str())) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}